

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::HistogramTest_observe_multiple_test_total_sum_Test::
~HistogramTest_observe_multiple_test_total_sum_Test
          (HistogramTest_observe_multiple_test_total_sum_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(HistogramTest, observe_multiple_test_total_sum) {
  Histogram histogram{{1, 2}};
  histogram.ObserveMultiple({5, 9, 3}, 20);
  histogram.ObserveMultiple({0, 20, 6}, 34);
  auto metric = histogram.Collect();
  auto h = metric.histogram;
  EXPECT_EQ(h.sample_count, 43U);
  EXPECT_EQ(h.sample_sum, 54);
}